

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O0

int run_test_utf8_decode1_overrun(void)

{
  uint uVar1;
  ssize_t sVar2;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char c [1];
  char *pcStack_18;
  char b [1];
  char *p;
  
  pcStack_18 = (char *)((long)&eval_a + 7);
  eval_a._7_1_ = 0x7f;
  uVar1 = uv__utf8_decode1(&stack0xffffffffffffffe8,(char *)&stack0xffffffffffffffe8);
  if ((ulong)uVar1 != 0x7f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x6c,"0x7F","==","uv__utf8_decode1(&p, b + 1)",0x7f,"==",(ulong)uVar1);
    abort();
  }
  if ((char **)pcStack_18 != &stack0xffffffffffffffe8) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x6d,"p","==","b + 1",pcStack_18,"==",&stack0xffffffffffffffe8);
    abort();
  }
  pcStack_18 = (char *)((long)&eval_a + 7);
  eval_a._7_1_ = 0xc0;
  uVar1 = uv__utf8_decode1(&stack0xffffffffffffffe8,(char *)&stack0xffffffffffffffe8);
  if ((ulong)uVar1 != 0xffffffff) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x72,"(unsigned) -1","==","uv__utf8_decode1(&p, b + 1)",0xffffffff,"==",(ulong)uVar1);
    abort();
  }
  if ((char **)pcStack_18 != &stack0xffffffffffffffe8) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x73,"p","==","b + 1",pcStack_18,"==",&stack0xffffffffffffffe8);
    abort();
  }
  eval_a._7_1_ = 0x7f;
  sVar2 = uv__idna_toascii((char *)((long)&eval_a + 7),(char *)((long)&eval_a + 7),
                           (char *)((long)&eval_a + 6),(char *)((long)&eval_a + 7));
  if (sVar2 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x76,"UV_EINVAL","==","uv__idna_toascii(b, b + 0, c, c + 1)",0xffffffffffffffea,"==",
            sVar2);
    abort();
  }
  sVar2 = uv__idna_toascii((char *)((long)&eval_a + 7),(char *)&stack0xffffffffffffffe8,
                           (char *)((long)&eval_a + 6),(char *)((long)&eval_a + 7));
  if (sVar2 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
            ,0x77,"UV_EINVAL","==","uv__idna_toascii(b, b + 1, c, c + 1)",0xffffffffffffffea,"==",
            sVar2);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(utf8_decode1_overrun) {
  const char* p;
  char b[1];
  char c[1];

  /* Single byte. */
  p = b;
  b[0] = 0x7F;
  ASSERT_EQ(0x7F, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  /* Multi-byte. */
  p = b;
  b[0] = 0xC0;
  ASSERT_EQ((unsigned) -1, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  b[0] = 0x7F;
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 0, c, c + 1));
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 1, c, c + 1));

  return 0;
}